

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

bool __thiscall Jupiter::HTTP::Server::Data::has(Data *this,string_view hostname)

{
  pointer puVar1;
  Host *pHVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_> *host;
  size_t sVar6;
  pointer puVar7;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  
  if (hostname._M_len == 0) {
    uVar5 = 0;
  }
  else {
    sVar6 = 0;
    uVar5 = 0;
    do {
      iVar4 = jessilib::fold((int)hostname._M_str[sVar6]);
      uVar5 = uVar5 + iVar4;
      sVar6 = sVar6 + 1;
    } while (hostname._M_len != sVar6);
  }
  puVar7 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar7 == puVar1) {
      return false;
    }
    pHVar2 = (puVar7->_M_t).
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
    if ((uVar5 == (pHVar2->super_Directory).name_checksum) &&
       (lhs._M_str = (pHVar2->super_Directory).name._M_dataplus._M_p,
       lhs._M_len = *(size_type *)((long)&(pHVar2->super_Directory).name + 8),
       bVar3 = jessilib::equalsi<char,char>(lhs,hostname), bVar3)) break;
    puVar7 = puVar7 + 1;
  }
  return true;
}

Assistant:

bool Jupiter::HTTP::Server::Data::has(std::string_view hostname) {
	unsigned int name_checksum = calc_checksumi(hostname);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && jessilib::equalsi(host->name, hostname)) {
			return true;
		}
	}

	return false;
}